

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O0

int beMsgGetListStrings(be_node *n,
                       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *values)

{
  be_node *node;
  longlong lVar1;
  undefined1 local_58 [8];
  string str;
  int len;
  be_node *val;
  int i;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values_local;
  be_node *n_local;
  
  if (n->type == BE_LIST) {
    val._4_4_ = 0;
    while (*(long *)((n->val).s + (long)val._4_4_ * 8) != 0) {
      node = *(be_node **)((n->val).s + (long)val._4_4_ * 8);
      if ((node == (be_node *)0x0) || (node->type != BE_STR)) {
        return 0;
      }
      lVar1 = be_str_len(node);
      str.field_2._12_4_ = (undefined4)lVar1;
      std::__cxx11::string::string((string *)local_58);
      std::__cxx11::string::append((char *)local_58,(node->val).i);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(values,(value_type *)local_58);
      std::__cxx11::string::~string((string *)local_58);
      val._4_4_ = val._4_4_ + 1;
    }
    n_local._4_4_ = 1;
  }
  else {
    n_local._4_4_ = 0;
  }
  return n_local._4_4_;
}

Assistant:

int beMsgGetListStrings(be_node *n, std::list<std::string> &values) {
	if (n->type != BE_LIST) {
		return 0;
	}
	for (int i = 0; n->val.l[i] != NULL; i++) {
		be_node *val = n->val.l[i];

		if (val == NULL || val->type != BE_STR)	
			return 0;

		int len = be_str_len(val);
		std::string str;
		str.append(val->val.s, len);
		values.push_back(str);
	}
        return 1;
}